

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::IsolinesRenderCase::~IsolinesRenderCase
          (IsolinesRenderCase *this)

{
  BasicVariousTessLevelsPosAttrCase::~BasicVariousTessLevelsPosAttrCase
            (&this->super_BasicVariousTessLevelsPosAttrCase);
  operator_delete(this,0xb0);
  return;
}

Assistant:

IsolinesRenderCase (Context& context, const char* name, const char* description, SpacingMode spacing, const char* referenceImagePathPrefix)
		: BasicVariousTessLevelsPosAttrCase (context, name, description, TESSPRIMITIVETYPE_ISOLINES, spacing, referenceImagePathPrefix)
	{
	}